

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_removal_reason.cpp
# Opt level: O3

string * RemovalReasonToString_abi_cxx11_(string *__return_storage_ptr__,MemPoolRemovalReason *r)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (ulong)*r;
  if (5 < uVar4) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/mempool_removal_reason.cpp"
                  ,0x14,"std::string RemovalReasonToString(const MemPoolRemovalReason &)");
  }
  iVar1 = *(int *)(&DAT_0084407c + uVar4 * 4);
  iVar2 = *(int *)(&DAT_00844094 + uVar4 * 4);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&DAT_0084407c + iVar1,&DAT_00844094 + iVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RemovalReasonToString(const MemPoolRemovalReason& r) noexcept
{
    switch (r) {
        case MemPoolRemovalReason::EXPIRY: return "expiry";
        case MemPoolRemovalReason::SIZELIMIT: return "sizelimit";
        case MemPoolRemovalReason::REORG: return "reorg";
        case MemPoolRemovalReason::BLOCK: return "block";
        case MemPoolRemovalReason::CONFLICT: return "conflict";
        case MemPoolRemovalReason::REPLACED: return "replaced";
    }
    assert(false);
}